

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O1

void __thiscall
Diligent::ShaderResourceHashKey::ShaderResourceHashKey<char_const*const&>
          (ShaderResourceHashKey *this,SHADER_TYPE _ShaderStages,char **Args)

{
  size_t Seed;
  SHADER_TYPE local_34;
  ulong local_30;
  size_t local_28;
  
  HashMapStringKey::HashMapStringKey(&this->super_HashMapStringKey,*Args,false);
  this->ShaderStages = _ShaderStages;
  local_30 = (this->super_HashMapStringKey).Ownership_Hash & 0x7fffffffffffffff;
  local_28 = 0;
  local_34 = _ShaderStages;
  HashCombine<unsigned_long,unsigned_int>(&local_28,&local_30,&local_34);
  (this->super_HashMapStringKey).Ownership_Hash = local_28 & 0x7fffffffffffffff;
  return;
}

Assistant:

ShaderResourceHashKey(const SHADER_TYPE _ShaderStages,
                          ArgsType&&... Args) noexcept :
        // clang-format off
        HashMapStringKey{std::forward<ArgsType>(Args)...},
        ShaderStages    {_ShaderStages}
    // clang-format on
    {
        Ownership_Hash = ComputeHash(GetHash(), Uint32{ShaderStages}) & HashMask;
    }